

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::SaveTraceForBugreport
          (ConsumerEndpointImpl *this,SaveTraceForBugreportCallback *consumer_callback)

{
  TracingServiceImpl *this_00;
  bool bVar1;
  anon_class_32_1_639d580e on_complete_callback;
  bool local_79;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::
  function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_78,consumer_callback);
  this_00 = this->service_;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_58._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = uStack_60;
  if (local_68 != (code *)0x0) {
    *(void **)local_58._M_unused._0_8_ = local_78._M_unused._M_object;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_78._8_8_;
    *(code **)((long)local_58._M_unused._0_8_ + 0x10) = local_68;
    local_68 = (code *)0x0;
    uStack_60 = 0;
  }
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59818:31)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59818:31)>
             ::_M_manager;
  bVar1 = MaybeSaveTraceForBugreport(this_00,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  if (!bVar1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "No trace with TraceConfig.bugreport_score > 0 eligible for bug reporting was found",
               "");
    local_79 = false;
    if ((consumer_callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*consumer_callback->_M_invoker)((_Any_data *)consumer_callback,&local_79,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_68 != (code *)0x0) {
    (*local_68)((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::SaveTraceForBugreport(
    SaveTraceForBugreportCallback consumer_callback) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  auto on_complete_callback = [consumer_callback] {
    if (rename(GetBugreportTmpPath().c_str(), GetBugreportPath().c_str())) {
      consumer_callback(false, "rename(" + GetBugreportTmpPath() + ", " +
                                   GetBugreportPath() + ") failed (" +
                                   strerror(errno) + ")");
    } else {
      consumer_callback(true, GetBugreportPath());
    }
  };
  if (!service_->MaybeSaveTraceForBugreport(std::move(on_complete_callback))) {
    consumer_callback(false,
                      "No trace with TraceConfig.bugreport_score > 0 eligible "
                      "for bug reporting was found");
  }
}